

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-dis.c
# Opt level: O0

void dis_dopp(decoctx *deco,dis_res *dres,uint64_t pos)

{
  uint64_t pos_local;
  dis_res *dres_local;
  decoctx *deco_local;
  
  dis_pp_insn(deco,dres,dres->insn,pos);
  return;
}

Assistant:

void dis_dopp(struct decoctx *deco, struct dis_res *dres, uint64_t pos) {
	dis_pp_insn(deco, dres, dres->insn, pos);
}